

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O0

void kv_free_kv_var_test(void)

{
  char str [11];
  int v;
  void *key;
  btree *tree;
  btree_kv_ops *kv_ops;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined1 uStackY_138;
  undefined1 local_137;
  btree_kv_ops *in_stack_fffffffffffffed0;
  key_len_t in_stack_fffffffffffffede;
  char *in_stack_fffffffffffffee0;
  undefined1 local_f8 [129];
  char local_77 [11];
  undefined4 local_6c;
  long local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  builtin_strncpy(local_77,"teststring",0xb);
  local_58 = local_f8;
  btree_str_kv_get_kb64_vb64(in_stack_fffffffffffffed0);
  local_137 = 4;
  local_6c = 1;
  local_60 = &uStackY_138;
  construct_key_ptr(in_stack_fffffffffffffee0,in_stack_fffffffffffffede,in_stack_fffffffffffffed0);
  (**(code **)(local_58 + 0x38))(local_60,&local_68,&local_6c);
  if (local_68 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x423);
    kv_free_kv_var_test::__test_pass = 0;
    if (local_68 != 0) {
      __assert_fail("key == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x423,"void kv_free_kv_var_test()");
    }
  }
  (**(code **)(local_58 + 0x38))(local_60,&local_68,&local_6c);
  if (local_68 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x427);
    kv_free_kv_var_test::__test_pass = 0;
    if (local_68 != 0) {
      __assert_fail("key == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x427,"void kv_free_kv_var_test()");
    }
  }
  memleak_end();
  if (kv_free_kv_var_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","kv_free_kv_var_test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","kv_free_kv_var_test");
  }
  return;
}

Assistant:

void kv_free_kv_var_test()
{
    TEST_INIT();
    memleak_start();

    btree_kv_ops *kv_ops;
    btree *tree;
    void *key;
    int v;
    char str[] = "teststring";

    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);
    tree = alca(struct btree, 1);
    tree->vsize = sizeof(v);
    v = 1;
    construct_key_ptr(str, sizeof(str), &key);

    // free kv string
    kv_ops->free_kv_var(tree, &key, (void *)&v);
    TEST_CHK(key == NULL);

    // attempt double free
    kv_ops->free_kv_var(tree, &key, (void *)&v);
    TEST_CHK(key == NULL);

    memleak_end();
    TEST_RESULT("kv_free_kv_var_test");
}